

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaTruth.c
# Opt level: O3

void Gia_ObjComputeTruthTableTest(Gia_Man_t *p)

{
  int iVar1;
  Vec_Int_t *pVVar2;
  ulong uVar3;
  long lVar4;
  int level;
  long lVar5;
  timespec ts;
  timespec local_28;
  
  iVar1 = clock_gettime(3,&local_28);
  if (iVar1 < 0) {
    lVar4 = 1;
  }
  else {
    lVar4 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_28.tv_nsec),8);
    lVar4 = ((lVar4 >> 7) - (lVar4 >> 0x3f)) + local_28.tv_sec * -1000000;
  }
  pVVar2 = p->vCos;
  uVar3 = (ulong)(uint)pVVar2->nSize;
  if (p->nRegs < pVVar2->nSize) {
    lVar5 = 0;
    do {
      if ((int)uVar3 <= lVar5) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      iVar1 = pVVar2->pArray[lVar5];
      if (((long)iVar1 < 0) || (p->nObjs <= iVar1)) {
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      Gia_ObjComputeTruthTable(p,p->pObjs + iVar1);
      lVar5 = lVar5 + 1;
      pVVar2 = p->vCos;
      uVar3 = (ulong)pVVar2->nSize;
    } while (lVar5 < (long)(uVar3 - (long)p->nRegs));
  }
  level = 3;
  iVar1 = clock_gettime(3,&local_28);
  if (iVar1 < 0) {
    lVar5 = -1;
  }
  else {
    lVar5 = local_28.tv_nsec / 1000 + local_28.tv_sec * 1000000;
  }
  Abc_Print(level,"%s =","Time");
  Abc_Print(level,"%9.2f sec\n",(double)(lVar5 + lVar4) / 1000000.0);
  return;
}

Assistant:

void Gia_ObjComputeTruthTableTest( Gia_Man_t * p )
{
    Gia_Obj_t * pObj;
    unsigned * pTruth;
    abctime clk = Abc_Clock();
    int i;
    Gia_ManForEachPo( p, pObj, i )
    {
        pTruth = (unsigned *)Gia_ObjComputeTruthTable( p, pObj );
//        Extra_PrintHex( stdout, pTruth, Gia_ManPiNum(p) ); printf( "\n" );
    }
    Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
}